

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_to_lower_bound.hpp
# Opt level: O3

void burst::
     skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>,long,std::less<void>>
               (long *range)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  
  plVar4 = (long *)*range;
  plVar1 = (long *)range[1];
  plVar3 = plVar4;
  if (plVar4 != plVar1) {
    do {
      plVar4 = plVar3 + 1;
      if (plVar4 == plVar1) goto LAB_00102c4c;
      lVar2 = *plVar3;
      plVar3 = plVar4;
    } while (lVar2 <= *plVar4);
  }
  if (plVar4 != plVar1) {
    __assert_fail("boost::algorithm::is_sorted(range, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/range/skip_to_lower_bound.hpp"
                  ,0x18,
                  "void burst::skip_to_lower_bound(Range &, const Value &, Compare) [Range = boost::iterator_range<__gnu_cxx::__normal_iterator<const long *, std::vector<long>>>, Value = long, Compare = std::less<void>]"
                 );
  }
LAB_00102c4c:
  detail::
  skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>,long,std::less<void>>
            ();
  return;
}

Assistant:

void skip_to_lower_bound (Range & range, const Value & goal, Compare compare)
    {
        BOOST_ASSERT(boost::algorithm::is_sorted(range, compare));
        detail::skip_to_lower_bound(range, goal, compare);
    }